

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void Curl_conn_ev_data_done_send(Curl_easy *data)

{
  void *in_R9;
  
  cf_cntrl_all(data->conn,data,true,8,0,in_R9);
  return;
}

Assistant:

void Curl_conn_ev_data_done_send(struct Curl_easy *data)
{
  cf_cntrl_all(data->conn, data, TRUE, CF_CTRL_DATA_DONE_SEND, 0, NULL);
}